

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall google::protobuf::internal::MapFieldBase::Clear(MapFieldBase *this)

{
  ReflectionPayload *this_00;
  
  this_00 = maybe_payload(this);
  if (this_00 != (ReflectionPayload *)0x0) {
    RepeatedPtrFieldBase::
    Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)this_00);
  }
  ClearMapNoSync(this);
  SetMapDirty(this);
  return;
}

Assistant:

void MapFieldBase::Clear() {
  if (ReflectionPayload* p = maybe_payload()) {
    p->repeated_field.Clear();
  }

  ClearMapNoSync();
  // Data in map and repeated field are both empty, but we can't set status
  // CLEAN. Because clear is a generated API, we cannot invalidate previous
  // reference to map.
  SetMapDirty();
}